

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::layoutChildren
          (AbstractScrollAreaPrivate *this,QStyleOption *opt)

{
  QRect *pQVar1;
  BlurEffect *pBVar2;
  bool bVar3;
  int iVar4;
  int h;
  QRect QVar5;
  QRect local_40;
  
  QVar5 = (QRect)QWidget::contentsRect();
  local_40 = QVar5;
  bVar3 = QWidget::isRightToLeft((QWidget *)this->q);
  local_40.x1 = (&this->right)[!bVar3] + QVar5.x1;
  local_40.y2 = QVar5.y2 - this->bottom;
  local_40.y1 = QVar5.y1 + this->top;
  local_40.x2 = QVar5.x2 - (&this->right)[bVar3];
  pQVar1 = (QRect *)this->viewport;
  QStyle::visualRect(*(LayoutDirection *)(opt + 0xc),(QRect *)(opt + 0x10),&local_40);
  QWidget::setGeometry(pQVar1);
  pBVar2 = this->horBlur;
  iVar4 = (**(code **)(*(long *)pBVar2 + 0x70))(pBVar2);
  QWidget::resize(&pBVar2->super_QWidget,iVar4,
                  (int)((double)((local_40.y2 - local_40.y1) + 1) * 0.75));
  iVar4 = local_40.x2 - local_40.x1;
  pBVar2 = this->vertBlur;
  (**(code **)(*(long *)pBVar2 + 0x70))(pBVar2);
  QWidget::resize(&pBVar2->super_QWidget,(int)((double)(iVar4 + 1) * 0.75),h);
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::layoutChildren( const QStyleOption & opt )
{
	QRect viewportRect = q->contentsRect();

	if( q->isRightToLeft() )
		viewportRect.adjust( right, top, -left, -bottom );
	else
		viewportRect.adjust( left, top, -right, -bottom );

	viewport->setGeometry( QStyle::visualRect( opt.direction, opt.rect,
		viewportRect ) );

	horBlur->resize( horBlur->sizeHint().width(),
		viewportRect.height() * 0.75 );

	vertBlur->resize( viewportRect.width() * 0.75,
		vertBlur->sizeHint().height() );
}